

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.h
# Opt level: O2

int __thiscall FStateLabelStorage::AddNames(FStateLabelStorage *this,TArray<FName,_FName> *names)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  
  uVar1 = names->Count;
  if ((int)uVar1 < 2) {
    iVar3 = names->Array->Index + 0x10000000;
  }
  else {
    uVar2 = TArray<unsigned_char,_unsigned_char>::Reserve(&this->Storage,uVar1 * 4 + 4);
    *(uint *)((this->Storage).Array + (int)uVar2) = uVar1;
    memcpy((this->Storage).Array + (long)(int)uVar2 + 4,names->Array,(ulong)names->Count << 2);
    iVar3 = (int)uVar2 / 4 + 1;
  }
  return iVar3;
}

Assistant:

int AddNames(TArray<FName> &names)
	{
		int siz = names.Size();
		if (siz > 1)
		{
			int pos = Storage.Reserve(sizeof(int) + sizeof(FName) * names.Size());
			memcpy(&Storage[pos], &siz, sizeof(int));
			memcpy(&Storage[pos + sizeof(int)], &names[0], sizeof(FName) * names.Size());
			return pos / 4 + 1;
		}
		else
		{
			// don't store single name states in the array.
			return names[0].GetIndex() + 0x10000000;
		}
	}